

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

bool jsonip::parser::notchar_<(char)34>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  bool bVar1;
  ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state_local;
  
  bVar1 = ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::at_end(state);
  if (bVar1) {
    state_local._7_1_ = false;
  }
  else {
    bVar1 = ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::match_at_pos(state,'\"');
    if (bVar1) {
      state_local._7_1_ = false;
    }
    else {
      ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::advance(state);
      state_local._7_1_ = true;
    }
  }
  return state_local._7_1_;
}

Assistant:

static inline bool match(S& state)
        {
            if (state.at_end()) return false;

            if (state.match_at_pos(c)) return false;
            state.advance();
            return true;
        }